

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::EltwiseParameter::MergeFrom(EltwiseParameter *this,EltwiseParameter *from)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  LogMessage *pLVar4;
  LogFinisher local_89;
  LogMessage local_88;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x6283);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  iVar1 = (from->coeff_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->coeff_,iVar1 + (this->coeff_).current_size_);
    memcpy(((this->coeff_).rep_)->elements + (this->coeff_).current_size_,
           ((from->coeff_).rep_)->elements,(long)(from->coeff_).current_size_ << 2);
    (this->coeff_).current_size_ = (this->coeff_).current_size_ + (from->coeff_).current_size_;
  }
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 3) != 0) {
    if ((uVar2 & 1) != 0) {
      this->operation_ = from->operation_;
    }
    if ((uVar2 & 2) != 0) {
      this->stable_prod_grad_ = from->stable_prod_grad_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar2;
  }
  return;
}

Assistant:

void EltwiseParameter::MergeFrom(const EltwiseParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.EltwiseParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  coeff_.MergeFrom(from.coeff_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 3u) {
    if (cached_has_bits & 0x00000001u) {
      operation_ = from.operation_;
    }
    if (cached_has_bits & 0x00000002u) {
      stable_prod_grad_ = from.stable_prod_grad_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}